

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O1

vm_obj_id_t __thiscall
CVmObjClass::find_mod_src_obj(CVmObjClass *this,vm_obj_id_t self,vm_obj_id_t mod_obj)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)self;
  while( true ) {
    uVar2 = *(uint *)((this->super_CVmObject).ext_ + 4);
    if (uVar2 != 0) {
      if (uVar2 == mod_obj) {
        return (vm_obj_id_t)uVar3;
      }
      iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar2 & 0xfff].ptr_ + 0x38))
                        (G_obj_table_X.pages_[uVar2 >> 0xc] + (uVar2 & 0xfff),mod_obj);
      if (iVar1 != 0) {
        return (vm_obj_id_t)uVar3;
      }
    }
    iVar1 = (*(this->super_CVmObject)._vptr_CVmObject[8])(this,uVar3);
    if (iVar1 == 0) {
      return 0;
    }
    uVar2 = (*(this->super_CVmObject)._vptr_CVmObject[9])(this,uVar3,0);
    if (uVar2 == 0) break;
    uVar3 = (ulong)uVar2;
    this = (CVmObjClass *)
           ((long)&G_obj_table_X.pages_[uVar2 >> 0xc]->ptr_ + (ulong)((uVar2 & 0xfff) * 0x18));
  }
  return 0;
}

Assistant:

vm_obj_id_t CVmObjClass::find_mod_src_obj(VMG_ vm_obj_id_t self,
                                          vm_obj_id_t mod_obj)
{
    vm_obj_id_t my_mod_obj;
    vm_obj_id_t sc;
    
    /* 
     *   Is this one of my modifier objects?  It is if it's my most
     *   specialized modifier object (i.e., get_mod_obj()), or if my most
     *   specialized modifier object descends from the given object. 
     */
    my_mod_obj = get_mod_obj();
    if (my_mod_obj != VM_INVALID_OBJ
        && (mod_obj == my_mod_obj
            || vm_objp(vmg_ my_mod_obj)->is_instance_of(vmg_ mod_obj)))
    {
        /* it's one of mine, so I'm the intrinsic class mod_obj modifies */
        return self;
    }

    /* 
     *   It's not one of mine, so check my superclasses recursively.  If we
     *   have no direct superclass, we've failed to find the object.  
     */
    if (get_superclass_count(vmg_ self) == 0
        || (sc = get_superclass(vmg_ self, 0)) == VM_INVALID_OBJ)
        return VM_INVALID_OBJ;
    
    /* ask the superclass to find the modifier */
    return ((CVmObjClass *)vm_objp(vmg_ sc))
        ->find_mod_src_obj(vmg_ sc, mod_obj);
}